

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastAndEffectiveFeaturePreservingMeshDenoising.cpp
# Opt level: O0

void __thiscall
FastAndEffectiveFeaturePreservingMeshDenoising::updateFilteredNormals
          (FastAndEffectiveFeaturePreservingMeshDenoising *this,TriMesh *mesh,
          vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          *filtered_normals)

{
  pointer *this_00;
  ParameterSet *pPVar1;
  double dVar2;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *pvVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  BaseHandle *pBVar7;
  reference pvVar8;
  reference __x;
  FaceIter FVar9;
  double local_280;
  vector_type local_1a0;
  double local_188;
  double weight;
  double value;
  Normal nj;
  undefined1 auStack_158 [4];
  int i;
  Normal temp_normal;
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> face_neighbor;
  Normal ni;
  undefined1 local_100 [8];
  FaceIter f_it;
  undefined1 local_e8 [4];
  int iter;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  previous_normals;
  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
  all_face_neighbor;
  FaceNeighborType face_neighbor_type;
  int local_90;
  allocator local_89;
  int normal_iteration_number;
  double local_68;
  double threshold_T;
  allocator local_49;
  string local_48 [36];
  int local_24;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *pvStack_20;
  int face_neighbor_index;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  *filtered_normals_local;
  TriMesh *mesh_local;
  FastAndEffectiveFeaturePreservingMeshDenoising *this_local;
  
  pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
  pvStack_20 = filtered_normals;
  filtered_normals_local =
       (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> *)mesh;
  mesh_local = (TriMesh *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"Face Neighbor",&local_49);
  bVar4 = ParameterSet::getValue(pPVar1,(string *)local_48,&local_24);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  if (((bVar4 ^ 0xffU) & 1) == 0) {
    pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&normal_iteration_number,"Threshold T",&local_89);
    bVar4 = ParameterSet::getValue(pPVar1,(string *)&normal_iteration_number,&local_68);
    std::__cxx11::string::~string((string *)&normal_iteration_number);
    std::allocator<char>::~allocator((allocator<char> *)&local_89);
    if (((bVar4 ^ 0xffU) & 1) == 0) {
      pPVar1 = (this->super_MeshDenoisingBase).parameter_set_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&face_neighbor_type,"Normal Iteration Num.",
                 (allocator *)
                 ((long)&all_face_neighbor.
                         super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      bVar4 = ParameterSet::getValue(pPVar1,(string *)&face_neighbor_type,&local_90);
      std::__cxx11::string::~string((string *)&face_neighbor_type);
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&all_face_neighbor.
                         super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      if (((bVar4 ^ 0xffU) & 1) == 0) {
        all_face_neighbor.
        super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = (FaceNeighborType)(local_24 != 0)
        ;
        this_00 = &previous_normals.
                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::
        vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ::vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  *)this_00);
        MeshDenoisingBase::getAllFaceNeighbor
                  (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                   (vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                    *)this_00,
                   (FaceNeighborType)
                   all_face_neighbor.
                   super__Vector_base<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,true);
        pvVar3 = pvStack_20;
        sVar6 = (*(code *)(filtered_normals_local->
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[1].super_VectorDataT<double,_3>
                          .values_[2])();
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        resize(pvVar3,sVar6);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *)local_e8);
        MeshDenoisingBase::getFaceNormal
                  (&this->super_MeshDenoisingBase,(TriMesh *)filtered_normals_local,
                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)local_e8);
        for (f_it.skip_bits_ = 0; (int)f_it.skip_bits_ < local_90;
            f_it.skip_bits_ = f_it.skip_bits_ + 1) {
          FVar9 = OpenMesh::PolyConnectivity::faces_begin
                            ((PolyConnectivity *)filtered_normals_local);
          while( true ) {
            f_it.mesh_ = FVar9._8_8_;
            local_100 = (undefined1  [8])FVar9.mesh_;
            FVar9 = OpenMesh::PolyConnectivity::faces_end
                              ((PolyConnectivity *)filtered_normals_local);
            ni.super_VectorDataT<double,_3>.values_[2] = (double)FVar9.mesh_;
            bVar4 = OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                  *)local_100,
                                 (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                  *)(ni.super_VectorDataT<double,_3>.values_ + 2));
            if (!bVar4) break;
            pBVar7 = &OpenMesh::Iterators::
                      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                      ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                    *)local_100)->super_BaseHandle;
            iVar5 = OpenMesh::BaseHandle::idx(pBVar7);
            pvVar8 = std::
                     vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   *)local_e8,(long)iVar5);
            ni.super_VectorDataT<double,_3>.values_[1] =
                 (pvVar8->super_VectorDataT<double,_3>).values_[2];
            face_neighbor.
            super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)(pvVar8->super_VectorDataT<double,_3>).values_[0];
            ni.super_VectorDataT<double,_3>.values_[0] =
                 (pvVar8->super_VectorDataT<double,_3>).values_[1];
            pBVar7 = &OpenMesh::Iterators::
                      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                      ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                    *)local_100)->super_BaseHandle;
            iVar5 = OpenMesh::BaseHandle::idx(pBVar7);
            __x = std::
                  vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                  ::operator[]((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                                *)&previous_normals.
                                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar5);
            std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                      ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                       (temp_normal.super_VectorDataT<double,_3>.values_ + 2),__x);
            OpenMesh::VectorT<double,_3>::VectorT((VectorT<double,_3> *)auStack_158,0.0,0.0,0.0);
            for (nj.super_VectorDataT<double,_3>.values_[2]._4_4_ = 0;
                iVar5 = nj.super_VectorDataT<double,_3>.values_[2]._4_4_,
                sVar6 = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                        size((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                             (temp_normal.super_VectorDataT<double,_3>.values_ + 2)),
                iVar5 < (int)sVar6;
                nj.super_VectorDataT<double,_3>.values_[2]._4_4_ =
                     nj.super_VectorDataT<double,_3>.values_[2]._4_4_ + 1) {
              pBVar7 = &std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                        operator[]((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                    *)(temp_normal.super_VectorDataT<double,_3>.values_ + 2),
                                   (long)nj.super_VectorDataT<double,_3>.values_[2]._4_4_)->
                        super_BaseHandle;
              iVar5 = OpenMesh::BaseHandle::idx(pBVar7);
              pvVar8 = std::
                       vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                     *)local_e8,(long)iVar5);
              nj.super_VectorDataT<double,_3>.values_[1] =
                   (pvVar8->super_VectorDataT<double,_3>).values_[2];
              value = (pvVar8->super_VectorDataT<double,_3>).values_[0];
              nj.super_VectorDataT<double,_3>.values_[0] =
                   (pvVar8->super_VectorDataT<double,_3>).values_[1];
              dVar2 = OpenMesh::VectorT<double,_3>::operator|
                                ((VectorT<double,_3> *)
                                 &face_neighbor.
                                  super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector_type *)&value);
              weight = dVar2 - local_68;
              if (weight <= 0.0) {
                local_280 = 0.0;
              }
              else {
                local_280 = weight * weight;
              }
              local_188 = local_280;
              OpenMesh::VectorT<double,_3>::operator*
                        (&local_1a0,(VectorT<double,_3> *)&value,&local_188);
              OpenMesh::VectorT<double,_3>::operator+=((VectorT<double,_3> *)auStack_158,&local_1a0)
              ;
            }
            OpenMesh::VectorT<double,_3>::normalize((VectorT<double,_3> *)auStack_158);
            pvVar3 = pvStack_20;
            pBVar7 = &OpenMesh::Iterators::
                      GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                      ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                                    *)local_100)->super_BaseHandle;
            iVar5 = OpenMesh::BaseHandle::idx(pBVar7);
            pvVar8 = std::
                     vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                     ::operator[](pvVar3,(long)iVar5);
            (pvVar8->super_VectorDataT<double,_3>).values_[0] = _auStack_158;
            (pvVar8->super_VectorDataT<double,_3>).values_[1] =
                 temp_normal.super_VectorDataT<double,_3>.values_[0];
            (pvVar8->super_VectorDataT<double,_3>).values_[2] =
                 temp_normal.super_VectorDataT<double,_3>.values_[1];
            std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~vector
                      ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                       (temp_normal.super_VectorDataT<double,_3>.values_ + 2));
            OpenMesh::Iterators::
            GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
            ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                          *)local_100,0);
            FVar9._8_8_ = f_it.mesh_;
            FVar9.mesh_ = (mesh_ptr)local_100;
          }
          std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
          ::operator=((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                       *)local_e8,pvStack_20);
        }
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        ~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 *)local_e8);
        std::
        vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
        ::~vector((vector<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>,_std::allocator<std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>_>_>
                   *)&previous_normals.
                      super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  return;
}

Assistant:

void FastAndEffectiveFeaturePreservingMeshDenoising::updateFilteredNormals(TriMesh &mesh, std::vector<TriMesh::Normal> &filtered_normals)
{
    // get parameter for normal update
    int face_neighbor_index;
    if(!parameter_set_->getValue(string("Face Neighbor"), face_neighbor_index))
        return;
    double threshold_T;
    if(!parameter_set_->getValue(string("Threshold T"), threshold_T))
        return;
    int normal_iteration_number;
    if(!parameter_set_->getValue(string("Normal Iteration Num."), normal_iteration_number))
        return;

    FaceNeighborType face_neighbor_type = (face_neighbor_index == 0) ? kVertexBased : kEdgeBased;

    std::vector< std::vector<TriMesh::FaceHandle> > all_face_neighbor;
    getAllFaceNeighbor(mesh, all_face_neighbor, face_neighbor_type, true);

    filtered_normals.resize(mesh.n_faces());

    std::vector<TriMesh::Normal> previous_normals;
    getFaceNormal(mesh, previous_normals);

    for(int iter = 0; iter < normal_iteration_number; iter++)
    {
        for(TriMesh::FaceIter f_it = mesh.faces_begin(); f_it != mesh.faces_end(); f_it++)
        {
            TriMesh::Normal ni = previous_normals[f_it->idx()];
            std::vector<TriMesh::FaceHandle> face_neighbor = all_face_neighbor[f_it->idx()];
            TriMesh::Normal temp_normal(0.0, 0.0, 0.0);
            for(int i = 0; i <(int)face_neighbor.size(); i++)
            {
                TriMesh::Normal nj = previous_normals[face_neighbor[i].idx()];
                double value = (ni | nj) - threshold_T;
                double weight = (value > 0) ? value * value : 0;
                temp_normal += nj * weight;
            }
            temp_normal.normalize();
            filtered_normals[f_it->idx()] = temp_normal;
        }
        previous_normals = filtered_normals;
    }
}